

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O0

void __thiscall TPZSubCompMesh::SetAnalysisSparse(TPZSubCompMesh *this,int numThreads)

{
  bool bVar1;
  TPZStructMatrix *pTVar2;
  TPZEquationFilter *pTVar3;
  TPZAnalysis *this_00;
  TPZStepSolver<double> *this_01;
  TPZAutoPointer<TPZMatrix<double>_> *refmat;
  TPZStructMatrix *this_02;
  TPZLinearAnalysis *pTVar4;
  void *pvVar5;
  TPZMatrixSolver<double> *this_03;
  int in_ESI;
  long in_RDI;
  TPZAutoPointer<TPZMatrixSolver<double>_> autostep;
  TPZStepSolver<double> *step;
  TPZAutoPointer<TPZMatrix<double>_> mat;
  int64_t numinternal;
  TPZAutoPointer<TPZStructMatrix> str;
  TPZCompMesh *in_stack_000001c0;
  size_t in_stack_00000328;
  char *in_stack_00000330;
  undefined4 in_stack_ffffffffffffff08;
  DecomposeType in_stack_ffffffffffffff0c;
  TPZStepSolver<double> *in_stack_ffffffffffffff10;
  TPZCompMesh *in_stack_ffffffffffffff28;
  TPZSSpStructMatrix<double,_TPZStructMatrixOR<double>_> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  TPZSubCompMesh *in_stack_ffffffffffffff48;
  TPZSubMeshAnalysis *in_stack_ffffffffffffff50;
  TPZAutoPointer local_60 [15];
  undefined1 local_51;
  void *local_48;
  TPZAutoPointer local_38 [8];
  TPZEquationFilter *local_30;
  TPZAutoPointer<TPZStructMatrix> local_28 [3];
  int local_c;
  
  local_c = in_ESI;
  operator_new(0x528);
  TPZSubMeshAnalysis::TPZSubMeshAnalysis(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TPZAutoPointer<TPZLinearAnalysis>::operator=
            ((TPZAutoPointer<TPZLinearAnalysis> *)in_stack_ffffffffffffff30,
             (TPZSubMeshAnalysis *)in_stack_ffffffffffffff28);
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff30,
             (TPZStructMatrix *)in_stack_ffffffffffffff28);
  operator_new(0xb8);
  TPZSSpStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZAutoPointer<TPZStructMatrix>::operator=
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff30,
             (TPZSSpStructMatrix<double,_TPZStructMatrixOR<double>_> *)in_stack_ffffffffffffff28);
  if (0 < local_c) {
    pTVar2 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
    TPZStrMatParInterface::SetNumThreads
              ((TPZStrMatParInterface *)(&pTVar2->field_0x0 + *(long *)(*(long *)pTVar2 + -0x60)),
               local_c);
  }
  TPZCompMesh::SaddlePermute(in_stack_000001c0);
  PermuteExternalConnects(this);
  pTVar2 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  TPZStrMatParInterface::SetNumThreads
            ((TPZStrMatParInterface *)(&pTVar2->field_0x0 + *(long *)(*(long *)pTVar2 + -0x60)),
             local_c);
  pTVar3 = (TPZEquationFilter *)
           NumInternalEquations
                     ((TPZSubCompMesh *)
                      CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  local_30 = pTVar3;
  pTVar2 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  this_00 = (TPZAnalysis *)::TPZStructMatrix::EquationFilter(pTVar2);
  TPZEquationFilter::SetMinMaxEq(pTVar3,(int64_t)pTVar2,(int64_t)this_00);
  pTVar2 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  this_01 = (TPZStepSolver<double> *)(**(code **)(*(long *)pTVar2 + 0x50))();
  if (this_01 == (TPZStepSolver<double> *)0x0) {
    refmat = (TPZAutoPointer<TPZMatrix<double>_> *)0x0;
  }
  else {
    refmat = (TPZAutoPointer<TPZMatrix<double>_> *)
             __dynamic_cast(this_01,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff30,
             (TPZMatrix<double> *)in_stack_ffffffffffffff28);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool(local_38);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"void TPZSubCompMesh::SetAnalysisSparse(int)");
    std::operator<<((ostream *)&std::cerr,"ERROR\n: Incompatible types. Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000330,in_stack_00000328);
  }
  this_02 = TPZAutoPointer<TPZStructMatrix>::operator->(local_28);
  pTVar3 = ::TPZStructMatrix::EquationFilter(this_02);
  TPZEquationFilter::Reset((TPZEquationFilter *)in_stack_ffffffffffffff10);
  pTVar4 = TPZAutoPointer<TPZLinearAnalysis>::operator->
                     ((TPZAutoPointer<TPZLinearAnalysis> *)(in_RDI + 0x940));
  TPZAutoPointer<TPZStructMatrix>::TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff10,
             (TPZAutoPointer<TPZStructMatrix> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  TPZAnalysis::SetStructuralMatrix(this_00,(TPZAutoPointer<TPZStructMatrix> *)pTVar2);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff10);
  pvVar5 = operator_new(0x100);
  local_51 = 1;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff10,
             (TPZAutoPointer<TPZMatrix<double>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  TPZStepSolver<double>::TPZStepSolver(this_01,refmat);
  local_51 = 0;
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff10);
  local_48 = pvVar5;
  TPZStepSolver<double>::SetDirect(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  TPZAutoPointer<TPZMatrixSolver<double>>::TPZAutoPointer<TPZStepSolver<double>>
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)pTVar3,(TPZStepSolver<double> *)pTVar4);
  pTVar4 = TPZAutoPointer<TPZLinearAnalysis>::operator->
                     ((TPZAutoPointer<TPZLinearAnalysis> *)(in_RDI + 0x940));
  this_03 = ::TPZAutoPointer::operator_cast_to_TPZMatrixSolver_(local_60);
  (*(pTVar4->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0x10])(pTVar4,this_03);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrixSolver<double>_> *)this_03);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<double>_> *)this_03)
  ;
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer((TPZAutoPointer<TPZStructMatrix> *)this_03);
  return;
}

Assistant:

void TPZSubCompMesh::SetAnalysisSparse(int numThreads)
{
    fAnalysis = new TPZSubMeshAnalysis(this);
    TPZAutoPointer<TPZStructMatrix> str = NULL;
    str = new TPZSSpStructMatrix<STATE>(this);
    if(numThreads > 0){
        str->SetNumThreads(numThreads);
    }
    
    SaddlePermute();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print(sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    PermuteExternalConnects();
    str->SetNumThreads(numThreads);
    int64_t numinternal = NumInternalEquations();
    str->EquationFilter().SetMinMaxEq(0, numinternal);
    TPZAutoPointer<TPZMatrix<STATE> > mat =
        dynamic_cast<TPZMatrix<STATE>*>(str->Create());
    if(!mat){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"ERROR\n: Incompatible types. Aborting...\n";
        DebugStop();
    }
    str->EquationFilter().Reset();
    fAnalysis->SetStructuralMatrix(str);
    TPZStepSolver<STATE> *step = new TPZStepSolver<STATE>(mat);
    step->SetDirect(ELDLt);
    TPZAutoPointer<TPZMatrixSolver<STATE> > autostep = step;
    fAnalysis->SetSolver(autostep);

}